

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void BYTE_OUT1R3(dill_stream s,int insn1,int rex,int insn2,int insn3,int insn4)

{
  undefined1 *puVar1;
  undefined1 in_CL;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined1 in_R8B;
  undefined4 in_R9D;
  uchar *tmp_ip;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*(ulong *)(*(long *)(in_RDI + 8) + 0x10) <= *(ulong *)(*(long *)(in_RDI + 8) + 8)) {
    extend_dill_stream((dill_stream_conflict)CONCAT44(in_ESI,in_EDX));
  }
  puVar1 = *(undefined1 **)(*(long *)(in_RDI + 8) + 8);
  if (in_EDX == 0) {
    *puVar1 = (char)in_ESI;
    puVar1[1] = in_CL;
    puVar1[2] = in_R8B;
    puVar1[3] = (char)in_R9D;
  }
  else {
    *puVar1 = (char)in_ESI;
    puVar1[1] = (byte)in_EDX | 0x40;
    puVar1[2] = in_CL;
    puVar1[3] = in_R8B;
    puVar1[4] = (char)in_R9D;
  }
  if (*(int *)(in_RDI + 0x18) != 0) {
    dump_cur_dill_insn((dill_stream_conflict)CONCAT44(in_R9D,in_stack_ffffffffffffffe0));
  }
  *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 4;
  if (in_EDX != 0) {
    *(long *)(*(long *)(in_RDI + 8) + 8) = *(long *)(*(long *)(in_RDI + 8) + 8) + 1;
  }
  return;
}

Assistant:

static void
BYTE_OUT1R3(dill_stream s, int insn1, int rex, int insn2, int insn3, int insn4)
{
    unsigned char* tmp_ip;
    if (s->p->cur_ip >= s->p->code_limit) {
        extend_dill_stream(s);
    }
    tmp_ip = (unsigned char*)s->p->cur_ip;
    if (rex != 0) {
        *(tmp_ip + 0) = (unsigned char)insn1;
        *(tmp_ip + 1) = (unsigned char)rex | 0x40;
        *(tmp_ip + 2) = (unsigned char)insn2;
        *(tmp_ip + 3) = (unsigned char)insn3;
        *(tmp_ip + 4) = (unsigned char)insn4;
    } else {
        *(tmp_ip) = (unsigned char)insn1;
        *(tmp_ip + 1) = (unsigned char)insn2;
        *(tmp_ip + 2) = (unsigned char)insn3;
        *(tmp_ip + 3) = (unsigned char)insn4;
    }
    if (s->dill_debug)
        dump_cur_dill_insn(s);
    s->p->cur_ip = ((char*)s->p->cur_ip) + 4;
    if (rex != 0)
        s->p->cur_ip++;
}